

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_wrappers_cartesian.cpp
# Opt level: O0

int main(void)

{
  Scalar *pSVar1;
  double *pdVar2;
  CartesianCrdView local_58;
  Vec3d *local_50;
  CartesianCrdView local_48;
  CartesianCrdView g2;
  CartesianCrd g1;
  Matrix<double,_3,_1,_0,_3,_1> v;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),0);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),1);
  *pSVar1 = 2.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),2);
  *pSVar1 = 3.0;
  dso::CartesianCrd::CartesianCrd
            ((CartesianCrd *)&g2,
             (Vec3d *)(g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2));
  pdVar2 = dso::CartesianCrd::x((CartesianCrd *)&g2);
  if ((*pdVar2 != 1.0) || (NAN(*pdVar2))) {
    __assert_fail("g1.x() == 1e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x16,"int main()");
  }
  pdVar2 = dso::CartesianCrd::y((CartesianCrd *)&g2);
  if ((*pdVar2 != 2.0) || (NAN(*pdVar2))) {
    __assert_fail("g1.y() == 2e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x17,"int main()");
  }
  pdVar2 = dso::CartesianCrd::z((CartesianCrd *)&g2);
  if ((*pdVar2 != 3.0) || (NAN(*pdVar2))) {
    __assert_fail("g1.z() == 3e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x18,"int main()");
  }
  dso::CartesianCrdView::CartesianCrdView
            (&local_48,
             (Vec3d *)(g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2));
  pdVar2 = dso::CartesianCrdView::y(&local_48);
  *pdVar2 = *pdVar2 - 2.0;
  pdVar2 = dso::CartesianCrdView::x(&local_48);
  if ((*pdVar2 != 1.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.x() == 1e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x1d,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::y(&local_48);
  if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.y() == 0e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x1e,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::z(&local_48);
  if ((*pdVar2 != 3.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.z() == 3e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x1f,"int main()");
  }
  pdVar2 = dso::CartesianCrd::y((CartesianCrd *)&g2);
  *pdVar2 = 4.0;
  pdVar2 = dso::CartesianCrdView::x(&local_48);
  if ((*pdVar2 != 1.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.x() == 1e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x23,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::y(&local_48);
  if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.y() == 0e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x24,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::z(&local_48);
  if ((*pdVar2 != 3.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.z() == 3e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x25,"int main()");
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),0);
  if ((*pSVar1 != 1.0) || (NAN(*pSVar1))) {
    __assert_fail("v(0) == 1e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x26,"int main()");
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),1);
  if ((*pSVar1 != 0.0) || (NAN(*pSVar1))) {
    __assert_fail("v(1) == 0e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x27,"int main()");
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      (g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 2),2);
  if ((*pSVar1 != 3.0) || (NAN(*pSVar1))) {
    __assert_fail("v(2) == 3e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x28,"int main()");
  }
  local_50 = local_48.mv;
  touch(local_48);
  pdVar2 = dso::CartesianCrdView::x(&local_48);
  if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.x() == 0e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x2c,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::y(&local_48);
  if ((*pdVar2 != -1.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.y() == -1e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x2d,"int main()");
  }
  pdVar2 = dso::CartesianCrdView::z(&local_48);
  if ((*pdVar2 != 2.0) || (NAN(*pdVar2))) {
    __assert_fail("g2.z() == 2e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x2e,"int main()");
  }
  pdVar2 = dso::CartesianCrd::x((CartesianCrd *)&g2);
  if ((*pdVar2 == 1.0) && (!NAN(*pdVar2))) {
    pdVar2 = dso::CartesianCrd::y((CartesianCrd *)&g2);
    if ((*pdVar2 != 4.0) || (NAN(*pdVar2))) {
      __assert_fail("g1.y() == 4e0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                    ,0x30,"int main()");
    }
    pdVar2 = dso::CartesianCrd::z((CartesianCrd *)&g2);
    if ((*pdVar2 != 3.0) || (NAN(*pdVar2))) {
      __assert_fail("g1.z() == 3e0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                    ,0x31,"int main()");
    }
    dso::CartesianCrdView::CartesianCrdView(&local_58,(CartesianCrd *)&g2);
    touch(local_58);
    pdVar2 = dso::CartesianCrd::x((CartesianCrd *)&g2);
    if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
      __assert_fail("g1.x() == 0e0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                    ,0x35,"int main()");
    }
    pdVar2 = dso::CartesianCrd::y((CartesianCrd *)&g2);
    if ((*pdVar2 == 3.0) && (!NAN(*pdVar2))) {
      pdVar2 = dso::CartesianCrd::z((CartesianCrd *)&g2);
      if ((*pdVar2 == 2.0) && (!NAN(*pdVar2))) {
        return 0;
      }
      __assert_fail("g1.z() == 2e0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                    ,0x37,"int main()");
    }
    __assert_fail("g1.y() == 3e0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                  ,0x36,"int main()");
  }
  __assert_fail("g1.x() == 1e0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                ,0x2f,"int main()");
}

Assistant:

int main() {

  Eigen::Matrix<double, 3, 1> v;
  v(0) = 1e0;
  v(1) = 2e0;
  v(2) = 3e0;

  /* contains its own vector, does not alter v */
  CartesianCrd g1(v);
  assert(g1.x() == 1e0);
  assert(g1.y() == 2e0);
  assert(g1.z() == 3e0);

  /* a view of v; will alter original vector v, but not g1 */
  CartesianCrdView g2(v);
  g2.y() -= 2e0;
  assert(g2.x() == 1e0);
  assert(g2.y() == 0e0);
  assert(g2.z() == 3e0);

  /* alter the instance g1; v and g2 should remain unchanged */
  g1.y() = 4e0;
  assert(g2.x() == 1e0);
  assert(g2.y() == 0e0);
  assert(g2.z() == 3e0);
  assert(v(0) == 1e0);
  assert(v(1) == 0e0);
  assert(v(2) == 3e0);

  /* alter the g2 instance via a function; should not change g1 */
  touch(g2);
  assert(g2.x() == 0e0);
  assert(g2.y() == -1e0);
  assert(g2.z() == 2e0);
  assert(g1.x() == 1e0);
  assert(g1.y() == 4e0);
  assert(g1.z() == 3e0);

  /* alter the g1 instance via a function */
  touch(CartesianCrdView(g1));
  assert(g1.x() == 0e0);
  assert(g1.y() == 3e0);
  assert(g1.z() == 2e0);

  return 0;
}